

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O2

void write_file(bsdtar *bsdtar,archive *a,archive_entry *entry)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  la_int64_t lVar4;
  
  iVar1 = archive_write_header(a,entry);
  if (iVar1 != 0) {
    if (bsdtar->verbose < 2) {
      pcVar2 = archive_entry_pathname(entry);
      pcVar3 = archive_error_string(a);
      lafe_warnc(0,"%s: %s",pcVar2,pcVar3);
    }
    else {
      safe_fprintf(_stderr,"a ");
      list_item_verbose(bsdtar,_stderr,entry);
      pcVar2 = archive_error_string(a);
      lafe_warnc(0,": %s",pcVar2);
    }
    if (iVar1 == -0x1e) goto LAB_0010ff20;
    if (iVar1 < -0x14) {
      return;
    }
  }
  lVar4 = archive_entry_size(entry);
  if ((lVar4 < 1) || (iVar1 = copy_file_data_block(bsdtar,a,bsdtar->diskreader,entry), iVar1 == 0))
  {
    return;
  }
LAB_0010ff20:
  exit(1);
}

Assistant:

static void
write_file(struct bsdtar *bsdtar, struct archive *a,
    struct archive_entry *entry)
{
	write_entry(bsdtar, a, entry);
}